

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelOverridesProperties::~IfcRelOverridesProperties
          (IfcRelOverridesProperties *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines = pvVar1;
  *(void **)(&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x19];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x88 = vtt[0x1a];
  (this->super_IfcRelDefinesByProperties).super_IfcRelDefines.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0xc0 = vtt[0x1c];
  *(void **)&(this->super_IfcRelDefinesByProperties).field_0xd8 = vtt[0x1d];
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                   *)&(this->super_IfcRelDefinesByProperties).field_0xe8);
  IfcRelDefines::~IfcRelDefines((IfcRelDefines *)this,vtt + 2);
  return;
}

Assistant:

IfcRelOverridesProperties() : Object("IfcRelOverridesProperties") {}